

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O2

void __thiscall
TPZBlockDiagonal<long_double>::AutoFill
          (TPZBlockDiagonal<long_double> *this,int64_t neq,int64_t jeq,int symmetric)

{
  longdouble *plVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  longdouble *plVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  TPZManVector<int,_10> *blocksize;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  longdouble in_ST0;
  longdouble lVar14;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  TPZStack<int,_10> blsizes;
  longdouble local_c0;
  long local_b0;
  long local_a0;
  TPZManVector<int,_10> local_78;
  
  if (neq == jeq) {
    TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_78);
    for (lVar7 = 0; lVar11 = neq - lVar7, lVar11 != 0 && lVar7 <= neq; lVar7 = lVar7 + lVar11) {
      iVar2 = rand();
      lVar3 = (iVar2 * neq) / 0x7fffffff;
      if (lVar3 < lVar11) {
        lVar11 = lVar3;
      }
      TPZStack<int,_10>::Push((TPZStack<int,_10> *)&local_78,(int)lVar11);
    }
    blocksize = &local_78;
    Initialize(this,&blocksize->super_TPZVec<int>);
    lVar7 = (this->fBlockSize).fNElements;
    lVar11 = 0;
    if (lVar7 < 1) {
      lVar7 = lVar11;
    }
    for (; lVar11 != lVar7; lVar11 = lVar11 + 1) {
      lVar3 = (this->fBlockPos).fStore[lVar11];
      lVar8 = (long)(this->fBlockSize).fStore[lVar11];
      lVar4 = 0;
      if (0 < lVar8) {
        lVar4 = lVar8;
      }
      local_b0 = lVar3 << 4;
      lVar9 = lVar8 * 0x10;
      lVar10 = 0;
      local_a0 = local_b0;
      for (lVar12 = 0; lVar12 != lVar4; lVar12 = lVar12 + 1) {
        if (symmetric == 1) {
          plVar1 = (this->fStorage).fStore;
          plVar5 = plVar1 + lVar3;
          local_c0 = (longdouble)0;
          for (lVar6 = 0; lVar13 = lVar12, lVar10 != lVar6; lVar6 = lVar6 + 0x10) {
            lVar14 = *(longdouble *)((long)plVar1 + lVar6 + local_b0);
            *(longdouble *)((long)plVar5 + lVar10) = lVar14;
            local_c0 = local_c0 + ABS(lVar14);
            plVar5 = plVar5 + lVar8;
          }
        }
        else {
          local_c0 = (longdouble)0;
          lVar13 = 0;
        }
        lVar6 = lVar9 * lVar13 + local_a0;
        for (; lVar13 < lVar8; lVar13 = lVar13 + 1) {
          TPZMatrix<long_double>::GetRandomVal
                    ((longdouble *)this,(TPZMatrix<long_double> *)blocksize);
          lVar14 = ABS(in_ST0) + local_c0;
          if (lVar12 == lVar13) {
            lVar14 = local_c0;
          }
          *(longdouble *)((long)(this->fStorage).fStore + lVar6) = in_ST0;
          lVar6 = lVar6 + lVar9;
          in_ST0 = in_ST1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = in_ST4;
          in_ST4 = in_ST5;
          local_c0 = lVar14;
        }
        plVar1 = (this->fStorage).fStore;
        if (ABS(plVar1[lVar3 + lVar12 + lVar12 * lVar8]) < local_c0) {
          plVar1[lVar3 + lVar12 + lVar12 * lVar8] = (longdouble)1 + local_c0;
        }
        lVar10 = lVar10 + 0x10;
        local_b0 = local_b0 + lVar9;
        local_a0 = local_a0 + 0x10;
      }
    }
    TPZManVector<int,_10>::~TPZManVector(&local_78);
    return;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzblockdiag.cpp"
             ,0x24f);
}

Assistant:

void TPZBlockDiagonal<TVar>::AutoFill(int64_t neq, int64_t jeq, int symmetric) {
    if (neq != jeq) {
        DebugStop();
    }
    TPZStack<int> blsizes;
    int64_t totalsize = 0;
    while (totalsize < neq) {
        int64_t blsize = (neq*rand())/RAND_MAX;
        blsize = blsize < neq-totalsize ? blsize : neq-totalsize;
        blsizes.Push(blsize);
        totalsize += blsize;
    }
    Initialize(blsizes);
    // Initialize the blocksizes!!
	int64_t b, bsize, eq = 0, pos;
	int64_t nb = fBlockSize.NElements(), r, c;
	for ( b=0; b<nb; b++) {
		pos= fBlockPos[b];
		bsize = fBlockSize[b];
		for(c=0; c<bsize; c++) {
            RTVar sum = 0.;
            r=0;
            if (symmetric == 1) {
                for (r=0; r<c; r++) {
                    fStorage[pos+c+r*bsize]=fStorage[pos+r+c*bsize];
                    sum += fabs(fStorage[pos+r+c*bsize]);
                }
            }
			for(; r<bsize; r++) {
				auto val = this->GetRandomVal();
				fStorage[pos+c+r*bsize] = (val);
                if(c!= r) sum += fabs(val);
			}
            //totototo
//            if(r==4)
//            {
//                std::cout << "sum " << sum << std::endl;
//            }
            if (fabs(fStorage[pos+c+c*bsize]) < sum) {
                fStorage[pos+c+c*bsize] = (TVar)(sum + (RTVar)1.);
            }
		}
		eq += bsize;
	}
}